

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_prov_mac.c
# Opt level: O2

void * id_tc26_cipher_gostr3412_2015_kuznyechik_ctracpkm_omac_newctx(void *provctx)

{
  GOST_CTX_conflict1 *pGVar1;
  
  pGVar1 = mac_newctx(provctx,&id_tc26_cipher_gostr3412_2015_kuznyechik_ctracpkm_omac_desc);
  return pGVar1;
}

Assistant:

static GOST_CTX *mac_newctx(void *provctx, const GOST_DESC *descriptor)
{
    GOST_CTX *gctx = NULL;

    if ((gctx = OPENSSL_zalloc(sizeof(*gctx))) != NULL) {
        gctx->provctx = provctx;
        gctx->descriptor = descriptor;
        gctx->mac_size = descriptor->initial_mac_size;
        gctx->digest = GOST_init_digest(descriptor->digest_desc);
        gctx->dctx = EVP_MD_CTX_new();

        if (gctx->digest == NULL
            || gctx->dctx == NULL
            || EVP_DigestInit_ex(gctx->dctx, gctx->digest,
                                 gctx->provctx->e) <= 0) {
            mac_freectx(gctx);
            gctx = NULL;
        }
    }
    return gctx;
}